

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_decompose.hpp
# Opt level: O1

result * __thiscall
lest::expression_lhs<std::__cxx11::string_const&>::operator!=
          (result *__return_storage_ptr__,expression_lhs<std::__cxx11::string_const&> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  lest *this_00;
  size_t __n;
  size_type sVar2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  string local_98;
  bool local_78;
  char *local_70;
  size_type local_68;
  char local_60 [8];
  undefined4 uStack_58;
  undefined4 uStack_54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = *(lest **)this;
  __n = *(size_t *)(this_00 + 8);
  local_78 = true;
  if (__n == rhs->_M_string_length) {
    if (__n == 0) {
      local_78 = false;
    }
    else {
      iVar3 = bcmp(*(void **)this_00,(rhs->_M_dataplus)._M_p,__n);
      local_78 = iVar3 != 0;
    }
  }
  local_b8 = &local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"!=","");
  if (local_b8 == &local_a8) {
    local_50.field_2._8_8_ = local_a8._8_8_;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50._M_dataplus._M_p = (pointer)local_b8;
  }
  local_50._M_string_length = local_b0;
  local_b0 = 0;
  local_a8._M_local_buf[0] = '\0';
  local_b8 = &local_a8;
  to_string<std::__cxx11::string,std::__cxx11::string>(&local_98,this_00,&local_50,rhs,in_R8);
  sVar2 = local_98._M_string_length;
  paVar1 = &local_98.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p == paVar1) {
    uStack_58 = local_98.field_2._8_4_;
    uStack_54 = local_98.field_2._12_4_;
    local_70 = local_60;
  }
  else {
    local_70 = local_98._M_dataplus._M_p;
  }
  local_68 = local_98._M_string_length;
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity._0_4_ =
       local_98.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  __return_storage_ptr__->passed = local_78;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_70,local_70 + sVar2);
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator<=( R const & rhs ) { return result{ lhs <= rhs, to_string( lhs, "<=", rhs ) }; }